

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O2

void jsonChildren::deleteChildren(jsonChildren *ptr)

{
  if (ptr != (jsonChildren *)0x0) {
    ~jsonChildren(ptr);
  }
  operator_delete(ptr);
  return;
}

Assistant:

inline static void deleteChildren(jsonChildren * ptr) json_nothrow {
	   #ifdef JSON_MEMORY_CALLBACKS
		  ptr -> ~jsonChildren();
		  libjson_free<jsonChildren>(ptr);
	   #else
		  delete ptr;
	   #endif
    }